

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_depth_pruning_tree_index_impl.h
# Opt level: O2

double __thiscall
ted::
TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
tree_dist(TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
          *this,TreeIndexAll *t1,TreeIndexAll *t2,int x,int y,int k,int e)

{
  int iVar1;
  BandMatrix<double> *this_00;
  PostLToDepth *this_01;
  InvertedListDepthToPostL *this_02;
  longlong *plVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  double *pdVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  size_type __n;
  size_type __n_00;
  size_t col;
  size_type __n_01;
  size_t row;
  int iVar18;
  size_t col_00;
  uint uVar19;
  size_type __n_02;
  int iVar20;
  size_t sVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  initializer_list<double> __l;
  double local_140;
  double local_48;
  double local_40;
  double local_38;
  
  __n = (size_type)x;
  uVar4 = (t1->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[__n];
  row = (size_t)(int)uVar4;
  uVar5 = (t2->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[y];
  this_00 = &(this->
             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             ).
             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .fd_;
  pdVar10 = data_structures::BandMatrix<double>::at(this_00,0,0);
  *pdVar10 = 0.0;
  uVar22 = e;
  if ((int)uVar5 < e) {
    uVar22 = uVar5;
  }
  if ((int)uVar22 < 1) {
    uVar22 = 0;
  }
  uVar25 = (ulong)uVar22;
  sVar21 = 1;
  while (bVar26 = uVar25 != 0, uVar25 = uVar25 - 1, bVar26) {
    pdVar10 = data_structures::BandMatrix<double>::read_at(this_00,0,sVar21 - 1);
    dVar27 = *pdVar10;
    pdVar10 = data_structures::BandMatrix<double>::at(this_00,0,sVar21);
    *pdVar10 = dVar27 + 1.0;
    sVar21 = sVar21 + 1;
  }
  if (e < (int)uVar5) {
    pdVar10 = data_structures::BandMatrix<double>::at(this_00,0,(long)(e + 1));
    *pdVar10 = INFINITY;
  }
  uVar22 = e;
  if ((int)uVar4 < e) {
    uVar22 = uVar4;
  }
  if ((int)uVar22 < 1) {
    uVar22 = 0;
  }
  uVar25 = (ulong)uVar22;
  sVar21 = 1;
  while (bVar26 = uVar25 != 0, uVar25 = uVar25 - 1, bVar26) {
    pdVar10 = data_structures::BandMatrix<double>::read_at(this_00,sVar21 - 1,0);
    dVar27 = *pdVar10;
    pdVar10 = data_structures::BandMatrix<double>::at(this_00,sVar21,0);
    *pdVar10 = dVar27 + 1.0;
    sVar21 = sVar21 + 1;
  }
  iVar1 = e + 1;
  if (e < (int)uVar4) {
    pdVar10 = data_structures::BandMatrix<double>::at(this_00,(long)iVar1,0);
    *pdVar10 = INFINITY;
  }
  this_01 = &t1->super_PostLToDepth;
  pvVar11 = std::vector<int,_std::allocator<int>_>::at(&this_01->postl_to_depth_,__n);
  iVar20 = *pvVar11;
  pvVar11 = std::vector<int,_std::allocator<int>_>::at
                      (&(t1->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_,__n);
  iVar6 = iVar20 + iVar1;
  if (*pvVar11 < iVar20 + iVar1) {
    iVar6 = *pvVar11;
  }
  this_02 = &t1->super_InvertedListDepthToPostL;
  __n_01 = (size_type)iVar6;
  __n_00 = 0xffffffffffffffff;
  do {
    __n_00 = __n_00 + 1;
    pvVar12 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::at(&this_02->inverted_list_depth_to_postl_,__n_01);
    pvVar11 = std::vector<int,_std::allocator<int>_>::at(pvVar12,__n_00);
    iVar20 = (int)(__n - row);
  } while (*pvVar11 <= iVar20);
  __n_02 = (__n - row) + 1;
  pvVar11 = std::vector<int,_std::allocator<int>_>::at(&this_01->postl_to_depth_,__n_02);
  if (iVar6 < *pvVar11) {
    pvVar12 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::at(&this_02->inverted_list_depth_to_postl_,__n_01);
    pvVar11 = std::vector<int,_std::allocator<int>_>::at(pvVar12,__n_00);
    uVar19 = *pvVar11 - iVar20;
    uVar22 = 1;
  }
  else {
    pvVar11 = std::vector<int,_std::allocator<int>_>::at(&this_01->postl_to_depth_,__n_02);
    uVar22 = (uint)(*pvVar11 == iVar6);
    uVar19 = 1;
  }
  iVar17 = (int)__n_00 + uVar22;
  do {
    uVar14 = e + uVar19;
    iVar23 = (((x + uVar5) - uVar4) - y) + uVar19;
    iVar18 = uVar19 - e;
    uVar22 = uVar19;
    do {
      uVar19 = uVar14;
      if ((int)uVar5 < (int)uVar14) {
        uVar19 = uVar5;
      }
      iVar24 = 1;
      if (1 < iVar18) {
        iVar24 = iVar18;
      }
      if ((int)uVar4 < (int)uVar22) {
        plVar2 = &(this->
                  super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  ).
                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  .
                  super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  .subproblem_counter_;
        *plVar2 = *plVar2 + 1;
        pdVar10 = data_structures::BandMatrix<double>::read_at(this_00,row - 1,(long)(int)uVar5);
        local_48 = *pdVar10 + 1.0;
        sVar21 = (long)(int)uVar5 - 1;
        pdVar10 = data_structures::BandMatrix<double>::read_at(this_00,row,sVar21);
        local_40 = *pdVar10 + 1.0;
        pdVar10 = data_structures::BandMatrix<double>::read_at(this_00,row - 1,sVar21);
        local_38 = 0.0;
        if ((t1->super_PostLToLabelId).postl_to_label_id_.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [__n] != (t2->super_PostLToLabelId).postl_to_label_id_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[y]) {
          local_38 = 1.0;
        }
        local_38 = local_38 + *pdVar10;
        __l._M_len = 3;
        __l._M_array = &local_48;
        dVar27 = std::min<double>(__l);
        uVar25 = -(ulong)((double)e < dVar27);
        return (double)(uVar25 & 0x7ff0000000000000 | ~uVar25 & (ulong)dVar27);
      }
      sVar21 = (size_t)(int)uVar22;
      if ((int)(e - uVar22) < -1) {
        pdVar10 = data_structures::BandMatrix<double>::at(this_00,sVar21,(long)(int)(~e + uVar22));
        *pdVar10 = INFINITY;
      }
      iVar24 = iVar23 - iVar24;
      uVar8 = uVar22 - e;
      if ((int)(uVar22 - e) < 2) {
        uVar8 = 1;
      }
      col = (size_t)uVar8;
      uVar7 = uVar22 + e;
      uVar8 = uVar7;
      if ((int)uVar5 < (int)uVar7) {
        uVar8 = uVar5;
      }
      while( true ) {
        if (((long)(int)uVar8 < (long)col) || (uVar22 == uVar4 && uVar19 == col)) break;
        plVar2 = &(this->
                  super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  ).
                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  .
                  super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  .subproblem_counter_;
        *plVar2 = *plVar2 + 1;
        iVar15 = -iVar24;
        if (0 < iVar24) {
          iVar15 = iVar24;
        }
        if (k < iVar15) {
          pdVar10 = data_structures::BandMatrix<double>::at(this_00,sVar21,col);
          *pdVar10 = INFINITY;
        }
        else {
          pdVar10 = data_structures::BandMatrix<double>::read_at(this_00,sVar21,col - 1);
          col_00 = (size_t)(int)((y - uVar5) + (int)col);
          dVar27 = *pdVar10 + 1.0;
          if (INFINITY <= dVar27) {
            dVar27 = INFINITY;
          }
          pdVar10 = data_structures::BandMatrix<double>::read_at
                              (&(this->
                                super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                ).
                                super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                .td_,(long)(int)(uVar22 + iVar20),col_00);
          dVar3 = *pdVar10;
          iVar15 = (t1->super_PostLToSize).postl_to_size_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[(int)(uVar22 + iVar20)];
          uVar16 = (t2->super_PostLToSize).postl_to_size_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[col_00];
          iVar9 = uVar22 - iVar15;
          if ((iVar9 != 0) || (dVar28 = 0.0, col != uVar16)) {
            uVar25 = -uVar16 + col;
            iVar15 = ~(iVar15 + e) + uVar22;
            if (iVar15 < 1) {
              iVar15 = 0;
            }
            dVar28 = INFINITY;
            iVar13 = (int)uVar25;
            if (iVar15 <= iVar13) {
              uVar16 = iVar1 + iVar9;
              if ((int)uVar5 < iVar1 + iVar9) {
                uVar16 = uVar5;
              }
              dVar28 = INFINITY;
              if (iVar13 <= (int)uVar16) {
                pdVar10 = data_structures::BandMatrix<double>::read_at
                                    (this_00,(long)iVar9,uVar25 & 0xffffffff);
                dVar28 = *pdVar10;
              }
            }
          }
          dVar29 = dVar3 + dVar28;
          if (dVar27 <= dVar3 + dVar28) {
            dVar29 = dVar27;
          }
          local_140 = dVar29;
          if ((uVar22 == 1) ||
             ((1 < (int)uVar22 &&
              (pvVar11 = std::vector<int,_std::allocator<int>_>::at
                                   (&this_01->postl_to_depth_,(long)(int)(iVar20 + -1 + uVar22)),
              *pvVar11 -
              (this_01->postl_to_depth_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[__n] <= iVar1)))) {
            pdVar10 = data_structures::BandMatrix<double>::read_at(this_00,(ulong)(uVar22 - 1),col);
            local_140 = *pdVar10 + 1.0;
            if (dVar29 <= *pdVar10 + 1.0) {
              local_140 = dVar29;
            }
          }
          pdVar10 = data_structures::BandMatrix<double>::at(this_00,sVar21,col);
          if (local_140 <= (double)e) {
            *pdVar10 = local_140;
          }
          else {
            *pdVar10 = INFINITY;
          }
        }
        col = col + 1;
        iVar24 = iVar24 + -1;
      }
      if ((int)uVar7 < (int)uVar5) {
        pdVar10 = data_structures::BandMatrix<double>::at(this_00,sVar21,(long)(int)(uVar7 + 1));
        *pdVar10 = INFINITY;
      }
      uVar19 = uVar22 + 1;
      uVar14 = uVar14 + 1;
      iVar23 = iVar23 + 1;
      iVar18 = iVar18 + 1;
      bVar26 = (int)uVar4 <= (int)uVar22;
      uVar22 = uVar19;
    } while (bVar26);
    pvVar11 = std::vector<int,_std::allocator<int>_>::at
                        (&this_01->postl_to_depth_,(long)(int)(iVar20 + uVar19));
    if (iVar6 < *pvVar11) {
      pvVar12 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::at(&this_02->inverted_list_depth_to_postl_,__n_01);
      pvVar11 = std::vector<int,_std::allocator<int>_>::at(pvVar12,(long)iVar17);
      uVar19 = *pvVar11 - iVar20;
      uVar22 = 1;
    }
    else {
      pvVar11 = std::vector<int,_std::allocator<int>_>::at
                          (&this_01->postl_to_depth_,(long)(int)(iVar20 + uVar19));
      uVar22 = (uint)(*pvVar11 == iVar6);
    }
    iVar17 = iVar17 + uVar22;
  } while( true );
}

Assistant:

double TouzetDepthPruningTreeIndex<CostModel, TreeIndex>::tree_dist(
    const TreeIndex& t1, const TreeIndex& t2, const int x,
    const int y, const int k, const int e) {
  int x_size = t1.postl_to_size_[x];
  int y_size = t2.postl_to_size_[y];
  
  // std::cout << "TouzetDepthPruningTreeIndex::tree_dist" << std::endl;
  
  // Calculates offsets that let us translate i and j to correct postorder ids.
  int x_off = x - x_size;
  int y_off = y - y_size;

  // Initial cases.
  fd_.at(0, 0) = 0.0; // (0,0) is always within e-strip.
  for (int j = 1; j <= std::min(y_size, e); ++j) { // i = 0; only j that are within e-strip.
    fd_.at(0, j) = fd_.read_at(0, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]);
  }
  if (e + 1 <= y_size) { // the first j that is outside e-strip
    fd_.at(0, e + 1) = std::numeric_limits<double>::infinity();
  }
  // QUESTION: Is it necessary to verify depths here?
  //           It is not, because these values will never be used. We write
  //           them not to verify the condition.
  for (int i = 1; i <= std::min(x_size, e); ++i) { // j = 0; only i that are within e-strip.
    fd_.at(i, 0) = fd_.read_at(i - 1, 0) + c_.del(t1.postl_to_label_id_[i + x_off]);
  }
  if (e + 1 <= x_size) { // the first i that is outside e-strip
    fd_.at(e + 1, 0) = std::numeric_limits<double>::infinity();
  }

  double candidate_result = std::numeric_limits<double>::infinity();

  // General cases.

  // NOTE: max_depth has to be set to min(depth(x)+e+1, max depth of T1_x)
  //       because e+1 may exceed the maximum depth of T1_x.
  // TODO: Figure out why e+1.
  int max_depth = std::min(t1.postl_to_depth_.at(x) + e + 1, t1.postl_to_subtree_max_depth_.at(x));

  int i = 1;
  int max_depth_it = 0;
  // Move max_depth_it to point to the first node within this subtree (T1_x).
  // TODO: This requires a scan of one depth inversted list. Can we do better?
  while (t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) < i + x_off) {
    ++max_depth_it;
  }
  // Set the first i-value for the loop
  // TODO: Make this if more elegant.
  if (t1.postl_to_depth_.at(i + x_off) > max_depth) {
    // x_off has to be substructed to get correct i.
    i = t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) - x_off;
    ++max_depth_it;
  } else if (t1.postl_to_depth_.at(i + x_off) == max_depth) {
    ++max_depth_it;
  }
  // Traversing truncated tree to filter out i-values based on depth.
  while (i <= x_size) {
    // Old if statement for filtering i-values based on depth.
    // if (t1_depth_[i + x_off] - t1_depth_[x] > e + 1) { continue; }
    if (i - e - 1 >= 1) { // First j that is outside e-strip.
      fd_.at(i, i - e - 1) = std::numeric_limits<double>::infinity();
    }
    for (int j = std::max(1, i - e); j <= std::min(i + e, y_size); ++j) { // only (i,j) that are in e-strip
      // The td(x_size-1, y_size-1) is computed differently.
      // TODO: This condition is evaluated too often but passes only on the
      //       last i and j.
      if (i == x_size && j == std::min(i + e, y_size)) {
        break;
      }
      ++subproblem_counter_;
      if (std::abs((i + x_off) - (j + y_off)) > k) {
        fd_.at(i, j) = std::numeric_limits<double>::infinity();
      } else {
        candidate_result = std::numeric_limits<double>::infinity();
        candidate_result = std::min(candidate_result, fd_.read_at(i, j - 1) +
            c_.ins(t2.postl_to_label_id_[j + y_off]));
        double td_read = td_.read_at(i + x_off, j + y_off);
        double fd_read = 0.0;
        // If one of the forests is a tree, look up the vlaues in fd_.
        // Otherwise, both forests are trees and the fd-part is empty.
        if (i - t1.postl_to_size_[i + x_off] != 0 || j - t2.postl_to_size_[j + y_off] != 0) {
          // If the values to read are outside of the band, they exceed
          // the threshold or are not present in the band-matrix.
          if (j - t2.postl_to_size_[j + y_off] < std::max(0, i - t1.postl_to_size_[i + x_off] - e - 1)) {
            fd_read = std::numeric_limits<double>::infinity();
          } else if (std::min(i - t1.postl_to_size_[i + x_off] + e + 1, y_size) < j - t2.postl_to_size_[j + y_off]) {
            fd_read = std::numeric_limits<double>::infinity();
          } else {
            fd_read = fd_.read_at(i - t1.postl_to_size_[i + x_off], j - t2.postl_to_size_[j + y_off]);
          }
        }
        candidate_result = std::min(candidate_result, fd_read + td_read);

        // Value at (i-1,j) may not be calculated due to truncated tree,
        // thus it has to be verified separately.
        // NOTE: For i=1 there may be an out of bound exception for depth
        //       lookup.
        if (i == 1 || (i > 1 && t1.postl_to_depth_.at(i - 1 + x_off) - t1.postl_to_depth_[x] <= e + 1)) {
          candidate_result = std::min(
            candidate_result,
            fd_.read_at(i - 1, j) + c_.del(t1.postl_to_label_id_[i + x_off])
          );
        }

        // None of the values in fd_ can be greater than e-value for this
        // subtree pair.
        if (candidate_result > e) {
          fd_.at(i, j) = std::numeric_limits<double>::infinity();
        } else {
          fd_.at(i, j) = candidate_result;
        }
      }
    }
    if (i + e + 1 <= y_size) { // Last j that is outside e-strip.
      fd_.at(i, i + e + 1) = std::numeric_limits<double>::infinity();
    }
    // Set next i to iterate.
    ++i;
    // NOTE: i <= x_size verifies depth and dil[max_depth] bounds.
    // NOTE: For i=x_size (subtree root) the depth is always smaller than
    //       max_depth.
    // TODO: Make this if more elegant.
    if (i <= x_size && t1.postl_to_depth_.at(i + x_off) > max_depth) {
      // If depth of i is greater than max_depth, there must be an ancestor
      // of i with depth equals max_depth, and max_depth_it points to it.
      // x_off has to be substructed to get correct i.
      i = t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) - x_off;
      ++max_depth_it;
    } else if (i <= x_size && t1.postl_to_depth_.at(i + x_off) == max_depth) {
      ++max_depth_it;
    }
  }
  
  ++subproblem_counter_;
  // QUESTION: Is it possible that for some e-value an infinity should be
  //           returned, because the last subproblem is too far away?
  candidate_result = std::min({
    fd_.read_at(x_size - 1, y_size) + c_.del(t1.postl_to_label_id_[x]),                 // Delete root in source subtree.
    fd_.read_at(x_size, y_size - 1) + c_.ins(t2.postl_to_label_id_[y]),                 // Insert root in destination subtree.
    fd_.read_at(x_size - 1, y_size - 1) + c_.ren(t1.postl_to_label_id_[x], t2.postl_to_label_id_[y]) // Rename root nodes of the subtrees.
  });
  // The distance between two subtrees cannot be greater than e-value for these
  // subtrees.
  if (candidate_result > e) {
    return std::numeric_limits<double>::infinity();
  } else {
    return candidate_result;
  }
}